

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O3

void __thiscall DBaseDecal::Serialize(DBaseDecal *this,FArchive *arc)

{
  FArchive *pFVar1;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar1 = FArchive::operator<<(arc,&this->LeftDistance);
  pFVar1 = FArchive::operator<<(pFVar1,&this->Z);
  pFVar1 = FArchive::operator<<(pFVar1,&this->ScaleX);
  pFVar1 = FArchive::operator<<(pFVar1,&this->ScaleY);
  pFVar1 = FArchive::operator<<(pFVar1,&this->Alpha);
  pFVar1 = FArchive::operator<<(pFVar1,&this->AlphaColor);
  pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)&this->Translation);
  pFVar1 = ::operator<<(pFVar1,&this->PicNum);
  pFVar1 = FArchive::operator<<(pFVar1,&this->RenderFlags);
  pFVar1 = ::operator<<(pFVar1,&this->RenderStyle);
  ::operator<<(pFVar1,&this->Sector);
  return;
}

Assistant:

void DBaseDecal::Serialize (FArchive &arc)
{
	Super::Serialize (arc);
	arc << LeftDistance
		<< Z
		<< ScaleX << ScaleY
		<< Alpha
		<< AlphaColor
		<< Translation
		<< PicNum
		<< RenderFlags
		<< RenderStyle
		<< Sector;
}